

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-sysctl-linux.c
# Opt level: O0

int uv__random_sysctl(void *buf,size_t buflen)

{
  long lVar1;
  int *piVar2;
  size_t local_a0;
  size_t n;
  char *pe;
  char *p;
  char uuid [16];
  int *local_70;
  uv__sysctl_args args;
  size_t buflen_local;
  void *buf_local;
  
  n = (long)buf + buflen;
  pe = (char *)buf;
  args.unused[3] = buflen;
  while( true ) {
    if (n <= pe) {
      return 0;
    }
    memset(&local_70,0,0x50);
    local_70 = uv__random_sysctl::name;
    args.name._0_4_ = 3;
    args._8_8_ = &p;
    args.oldval = &local_a0;
    local_a0 = 0x10;
    lVar1 = syscall(0x9c,&local_70);
    if (lVar1 == -1) break;
    if (local_a0 != 0x10) {
      return -5;
    }
    p._6_1_ = uuid[6];
    uuid[0] = uuid[7];
    local_a0 = n - (long)pe;
    if (0xe < local_a0) {
      local_a0 = 0xe;
    }
    memcpy(pe,&p,local_a0);
    pe = pe + local_a0;
  }
  piVar2 = __errno_location();
  return -*piVar2;
}

Assistant:

int uv__random_sysctl(void* buf, size_t buflen) {
  static int name[] = {1 /*CTL_KERN*/, 40 /*KERN_RANDOM*/, 6 /*RANDOM_UUID*/};
  struct uv__sysctl_args args;
  char uuid[16];
  char* p;
  char* pe;
  size_t n;

  p = buf;
  pe = p + buflen;

  while (p < pe) {
    memset(&args, 0, sizeof(args));

    args.name = name;
    args.nlen = ARRAY_SIZE(name);
    args.oldval = uuid;
    args.oldlenp = &n;
    n = sizeof(uuid);

    /* Emits a deprecation warning with some kernels but that seems like
     * an okay trade-off for the fallback of the fallback: this function is
     * only called when neither getrandom(2) nor /dev/urandom are available.
     * Fails with ENOSYS on kernels configured without CONFIG_SYSCTL_SYSCALL.
     * At least arm64 never had a _sysctl system call and therefore doesn't
     * have a SYS__sysctl define either.
     */
#ifdef SYS__sysctl
    if (syscall(SYS__sysctl, &args) == -1)
      return UV__ERR(errno);
#else
    {
      (void) &args;
      return UV_ENOSYS;
    }
#endif

    if (n != sizeof(uuid))
      return UV_EIO;  /* Can't happen. */

    /* uuid[] is now a type 4 UUID. Bytes 6 and 8 (counting from zero) contain
     * 4 and 5 bits of entropy, respectively. For ease of use, we skip those
     * and only use 14 of the 16 bytes.
     */
    uuid[6] = uuid[14];
    uuid[8] = uuid[15];

    n = pe - p;
    if (n > 14)
      n = 14;

    memcpy(p, uuid, n);
    p += n;
  }

  return 0;
}